

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamIGA::SetNodesGenericOrder
          (ChElementBeamIGA *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          *mynodes,vector<double,_std::allocator<double>_> *myknots,int myorder)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  ChVectorDynamic<> *this_01;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  pointer psVar5;
  pointer pdVar6;
  double *pdVar7;
  undefined8 uVar8;
  ulong uVar9;
  ChElementBeamIGA *pCVar10;
  int iVar11;
  int iVar12;
  undefined4 in_register_0000000c;
  long lVar13;
  pointer psVar14;
  ulong uVar15;
  long lVar16;
  double *pdVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_88;
  undefined8 local_68;
  ChVectorDynamic<> *local_60;
  ChElementBeamIGA *local_58;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_50;
  ChVariables *local_38;
  undefined1 auVar25 [32];
  undefined1 auVar24 [32];
  
  local_68 = CONCAT44(in_register_0000000c,myorder);
  iVar11 = myorder + 1;
  this_00 = &this->nodes;
  this->order = myorder;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(this_00,(long)iVar11);
  psVar14 = (mynodes->
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((mynodes->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar14) {
    lVar13 = 8;
    uVar20 = 0;
    do {
      psVar5 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)psVar5 + lVar13 + -8) = *(undefined8 *)((long)psVar14 + lVar13 + -8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar5->
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar13),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar14->
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar13));
      psVar14 = (mynodes->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar20 = uVar20 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar20 < (ulong)((long)(mynodes->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4
                             ));
  }
  this_01 = &this->knots;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)(int)local_68 + 1 +
             ((long)(this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  pdVar6 = (myknots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(myknots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar6;
  if (lVar13 != 0) {
    uVar20 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    pdVar7 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    lVar13 = lVar13 >> 3;
    uVar15 = 0;
    do {
      if ((~((long)uVar20 >> 0x3f) & uVar20) == uVar15) goto LAB_00687f85;
      pdVar7[uVar15] = pdVar6[uVar15];
      uVar15 = uVar15 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != uVar15);
  }
  local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
  local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (ChVariables **)0x0;
  local_60 = this_01;
  local_58 = this;
  if ((mynodes->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (mynodes->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar20 = 0;
    do {
      local_38 = (ChVariables *)
                 (**(code **)(**(long **)((long)&(((this_00->
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr + lVar13) + 0x40))();
      if (local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
        _M_realloc_insert<chrono::ChVariables*>
                  ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_38;
        local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar20 = uVar20 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar20 < (ulong)((long)(mynodes->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(mynodes->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_50,&local_88);
  pCVar10 = local_58;
  ChKblockGeneric::SetVariables
            (&(local_58->super_ChElementBeam).super_ChElementGeneric.Kmatr,&local_50);
  if (local_50.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar4 = pCVar10->order;
  lVar13 = (long)(int)uVar4;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = ((double)(int)uVar4 + 1.0) * 0.5;
  auVar33 = vroundsd_avx(auVar33,auVar33,10);
  iVar12 = (int)auVar33._0_8_;
  pCVar10->int_order_b = iVar12;
  if ((lVar13 < 0) ||
     (uVar20 = (pCVar10->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows, (long)uVar20 <= lVar13)) {
LAB_00687f85:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  lVar16 = (long)(int)~uVar4 + uVar20;
  if ((lVar16 < 0) || (!CARRY8((long)(int)~uVar4,uVar20))) goto LAB_00687f85;
  pdVar7 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  dVar1 = pdVar7[lVar13];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1;
  dVar2 = pdVar7[lVar16];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar2;
  if (uVar4 == 0) {
    bVar21 = false;
LAB_00687e52:
    bVar22 = false;
  }
  else {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x1020304050607));
    auVar33 = vpmovsxbq_avx(ZEXT216(1));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vbroadcastsd_avx512f(auVar35);
    uVar15 = 0;
    auVar29 = vpbroadcastq_avx512f();
    pdVar17 = pdVar7 + lVar13 + -8;
    auVar30 = vpermq_avx512f(auVar26,auVar29);
    auVar31 = ZEXT1664(auVar33);
    do {
      auVar36 = auVar31;
      auVar31 = vpbroadcastq_avx512f();
      uVar15 = uVar15 + 8;
      auVar32 = vporq_avx512f(auVar31,auVar27);
      auVar31 = vpermq_avx512f(auVar26,auVar32);
      uVar9 = vpcmpuq_avx512f(auVar31,auVar30,2);
      auVar31._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * (long)pdVar17[1];
      auVar31._0_8_ = (ulong)((byte)uVar9 & 1) * (long)*pdVar17;
      auVar31._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * (long)pdVar17[2];
      auVar31._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * (long)pdVar17[3];
      auVar31._32_8_ = (ulong)((byte)(uVar9 >> 4) & 1) * (long)pdVar17[4];
      auVar31._40_8_ = (ulong)((byte)(uVar9 >> 5) & 1) * (long)pdVar17[5];
      auVar31._48_8_ = (ulong)((byte)(uVar9 >> 6) & 1) * (long)pdVar17[6];
      auVar31._56_8_ = (uVar9 >> 7) * (long)pdVar17[7];
      pdVar17 = pdVar17 + -8;
      auVar31 = vpermq_avx512f(auVar26,auVar31);
      uVar8 = vcmppd_avx512f(auVar31,auVar28,0);
      auVar24 = vpmovm2d_avx512vl(uVar8);
      auVar24 = vpsubd_avx2(auVar36._0_32_,auVar24);
      auVar31 = ZEXT3264(auVar24);
    } while ((uVar4 + 7 & 0xfffffff8) != uVar15);
    uVar15 = vpcmpuq_avx512f(auVar32,auVar29,2);
    auVar24 = vmovdqa32_avx512vl(auVar24);
    bVar21 = (bool)((byte)uVar15 & 1);
    auVar23._0_4_ = (uint)bVar21 * auVar24._0_4_ | (uint)!bVar21 * auVar36._0_4_;
    bVar21 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar21 * auVar24._4_4_ | (uint)!bVar21 * auVar36._4_4_;
    bVar21 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar21 * auVar24._8_4_ | (uint)!bVar21 * auVar36._8_4_;
    bVar21 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar21 * auVar24._12_4_ | (uint)!bVar21 * auVar36._12_4_;
    bVar21 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar21 * auVar24._16_4_ | (uint)!bVar21 * auVar36._16_4_;
    auVar25._0_16_ = auVar23;
    bVar21 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar21 * auVar24._20_4_ | (uint)!bVar21 * auVar36._20_4_;
    bVar21 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar21 * auVar24._24_4_ | (uint)!bVar21 * auVar36._24_4_;
    bVar21 = SUB81(uVar15 >> 7,0);
    auVar25._28_4_ = (uint)bVar21 * auVar24._28_4_ | (uint)!bVar21 * auVar36._28_4_;
    auVar33 = vphaddd_avx(auVar25._16_16_,auVar23);
    auVar33 = vphaddd_avx(auVar33,auVar33);
    auVar33 = vphaddd_avx(auVar33,auVar33);
    bVar21 = 1 < auVar33._0_4_;
    if (uVar4 == 0) goto LAB_00687e52;
    iVar19 = (int)uVar20 - uVar4;
    uVar18 = 1;
    uVar15 = (ulong)iVar19;
    do {
      if ((iVar19 < 0) || (uVar20 <= uVar15)) goto LAB_00687f85;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pdVar7[uVar15];
      uVar8 = vcmpsd_avx512f(auVar34,auVar3,0);
      uVar15 = uVar15 + 1;
      uVar18 = uVar18 + ((uint)uVar8 & 1);
    } while ((long)uVar15 < (long)(int)uVar20);
    bVar22 = 1 < uVar18;
    bVar21 = 1 < auVar33._0_4_ || bVar22;
  }
  iVar19 = iVar12;
  switch(quadrature_type) {
  case 0:
    pCVar10->int_order_b = iVar11;
    pCVar10->int_order_s = iVar11;
    iVar19 = iVar11;
    break;
  case 2:
    iVar19 = (int)local_68;
    goto LAB_00687f42;
  case 3:
    pCVar10->int_order_s = 1;
    pCVar10->int_order_b = 1;
    iVar19 = 1;
    if (!bVar21) break;
    pCVar10->int_order_b = iVar12;
  case 1:
    pCVar10->int_order_s = iVar12;
    iVar19 = iVar12;
    break;
  case 4:
    pCVar10->int_order_s = 1;
    pCVar10->int_order_b = 1;
    if (((uVar4 == 2) && (dVar1 < 0.5)) && (0.5 <= dVar2)) {
LAB_00687ec0:
      pCVar10->int_order_s = 2;
      pCVar10->int_order_b = 2;
      iVar19 = 2;
      break;
    }
    goto LAB_00687f2d;
  case 5:
    pCVar10->int_order_s = 1;
    pCVar10->int_order_b = 1;
    if ((bool)(uVar4 == 2 & bVar22)) goto LAB_00687ec0;
LAB_00687f2d:
    iVar19 = 1;
    if ((bool)(2 < (int)uVar4 & bVar21)) {
      iVar19 = uVar4 - 1;
LAB_00687f42:
      pCVar10->int_order_b = iVar19;
      pCVar10->int_order_s = iVar19;
    }
    break;
  default:
    break;
  }
  pCVar10->int_order_s = iVar19;
  if (local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChElementBeamIGA::SetNodesGenericOrder(std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes,
                                            std::vector<double> myknots,
                                            int myorder) {
    this->order = myorder;

    nodes.resize(myorder + 1);
    for (int i = 0; i < mynodes.size(); ++i) {
        nodes[i] = mynodes[i];
    }
    knots.resize(nodes.size() + myorder + 1);
    for (int i = 0; i < myknots.size(); ++i) {
        knots(i) = myknots[i];
    }

    std::vector<ChVariables*> mvars;
    for (int i = 0; i < mynodes.size(); ++i) {
        mvars.push_back(&nodes[i]->Variables());
    }
    Kmatr.SetVariables(mvars);

    // integration for in-between elements:
    // int_order_s = 1;

    // FULL OVER INTEGRATION:
    // int_order_b = myorder+1;
    // FULL EXACT INTEGRATION:
    int_order_b = (int)std::ceil((this->order + 1.0) / 2.0);
    // REDUCED INTEGRATION:
    // int_order_b = myorder;
    // SELECTIVE INTEGRATION:
    // int_order_b = 1;

    // ensure integration order is odd, to have a centered gauss point
    // if (int_order_b % 2 == 0) {
    //	int_order_b += 1;
    //}

    bool is_middle = false;
    bool is_end_A = false;
    bool is_end_B = false;

    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    if (u1 < 0.5 && u2 >= 0.5) {
        // GetLog() << " -- IS_MIDDLE ";
        is_middle = true;
    }
    // Full integration for end elements:
    int multiplicity_a = 1;
    int multiplicity_b = 1;
    for (int im = order - 1; im >= 0; --im) {
        if (knots(im) == knots(order))  // extreme of span
            ++multiplicity_a;
    }
    for (int im = (int)knots.size() - order; im < (int)knots.size(); ++im) {
        if (knots(im) == knots(knots.size() - order - 1))  // extreme of span
            ++multiplicity_b;
    }
    if (multiplicity_a > 1)
        is_end_A = true;
    if (multiplicity_b > 1)
        is_end_B = true;

    if (this->quadrature_type == QuadratureType::FULL_EXACT) {
        int_order_b = (int)std::ceil((this->order + 1.0) / 2.0);
        int_order_s = (int)std::ceil((this->order + 1.0) / 2.0);
    }
    if (this->quadrature_type == QuadratureType::FULL_OVER) {
        int_order_b = myorder + 1;
        int_order_s = myorder + 1;
    }
    if (this->quadrature_type == QuadratureType::REDUCED) {
        int_order_b = myorder;
        int_order_s = myorder;
    }
    if (this->quadrature_type == QuadratureType::SELECTIVE) {
        int_order_b = 1;  // int_order_b = my_order;
        int_order_s = 1;
        if (is_end_A || is_end_B) {
            int_order_b = (int)std::ceil((this->order + 1.0) / 2.0);
            int_order_s = (int)std::ceil((this->order + 1.0) / 2.0);
        }
    }
    if (this->quadrature_type == QuadratureType::CUSTOM1) {
        int_order_b = 1;
        int_order_s = 1;
        if (order == 2) {
            if (is_middle) {
                int_order_s = 2;
                int_order_b = 2;
            }
        }
        if (order >= 3) {
            if (is_end_A || is_end_B) {
                int_order_b = order - 1;
                int_order_s = order - 1;
            }
        }
    }
    if (this->quadrature_type == QuadratureType::URI2) {
        int_order_b = 1;
        int_order_s = 1;
        if (order == 2) {
            if (is_end_B) {
                int_order_s = 2;
                int_order_b = 2;
            }
        }
        if (order >= 3) {
            if (is_end_A || is_end_B) {
                int_order_b = order - 1;
                int_order_s = order - 1;
            }
        }
    }

    // TRICK - FOR THE MOMENT ENSURE NO SELECTIVE CAUSE NOT YET IMPLEMENTED DIFFERENT GAUSS PTS FOR BEND/SHEAR
    int_order_s = int_order_b;

    /*
    GetLog() << "Element order p=" << this->order << ",   u in (" << u1 << ", " << u2 << ")";
    GetLog() << "   orders:  b=" << int_order_b << "   s=" << int_order_s;
    GetLog() << "\n";
    */
}